

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O3

void __thiscall
snestistics::AnnotationResolver::load(AnnotationResolver *this,istream *input,string *error_file)

{
  pointer *ppHVar1;
  iterator __position;
  undefined8 uVar2;
  int iVar3;
  Hint *pHVar4;
  long *plVar5;
  Hint HVar6;
  long *plVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  Hint ta;
  string comment;
  Pointer start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string useComment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char name [1024];
  char mycomment [1024];
  char buf [4096];
  bool local_194c;
  undefined1 local_1948 [40];
  _Alloc_hider local_1920;
  size_type local_1918;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1910;
  bool local_1900;
  _Alloc_hider local_18f8;
  size_type local_18f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18e8;
  Pointer local_18d8;
  Pointer local_18d4;
  undefined1 *local_18d0;
  long local_18c8;
  undefined1 local_18c0 [20];
  Pointer local_18ac;
  long *local_18a8;
  long local_18a0;
  long local_1898;
  long lStack_1890;
  undefined1 *local_1888;
  char *local_1880;
  undefined1 local_1878 [16];
  string *local_1868;
  vector<snestistics::Hint,std::allocator<snestistics::Hint>> *local_1860;
  undefined1 *local_1858 [2];
  undefined1 local_1848 [16];
  char local_1838;
  char cStack_1837;
  char cStack_1836;
  char cStack_1835;
  char cStack_1834;
  char cStack_1833;
  char cStack_1832;
  char cStack_1831;
  char cStack_1830;
  char cStack_182f;
  char cStack_182e;
  char cStack_182d;
  char cStack_182c;
  char cStack_182b;
  char cStack_182a;
  char cStack_1829;
  char local_1438 [1024];
  byte local_1038;
  char local_1037;
  char local_1036 [4102];
  
  local_18d0 = local_18c0;
  local_18c8 = 0;
  local_18c0[0] = 0;
  local_1888 = local_1878;
  local_1880 = (char *)0x0;
  local_1878[0] = 0;
  memset(&local_1838,0,0x400);
  lVar10 = *(long *)(*(long *)input + -0x18);
  if (((byte)input[lVar10 + 0x20] & 2) == 0) {
    local_1860 = (vector<snestistics::Hint,std::allocator<snestistics::Hint>> *)&this->_hints;
    uVar9 = 1;
    local_194c = false;
    local_1868 = error_file;
    do {
      std::ios::widen((char)lVar10 + (char)input);
      std::istream::getline((char *)input,(long)&local_1038,'\0');
      pcVar8 = local_1880;
      if (local_1038 < 0x3b) {
        if (local_1038 != 0) {
          if (local_1038 == 0x23) {
            strlen(local_1036);
            std::__cxx11::string::_M_replace((ulong)&local_1888,0,pcVar8,(ulong)local_1036);
          }
          else {
LAB_00122eba:
            iVar3 = __isoc99_sscanf(&local_1038,"hint %06X %s",&local_18ac);
            if (iVar3 < 1) {
              local_1948._0_8_ = local_1948._0_8_ & 0xffffffff00000000;
              local_1948._8_8_ = (long)local_1948 + 0x18;
              local_1948._16_8_ = (char *)0x0;
              local_1948._24_8_ = local_1948._24_8_ & 0xffffffffffffff00;
              local_1920._M_p = (pointer)&local_1910;
              local_1918 = 0;
              local_1910._M_local_buf[0] = '\0';
              local_1900 = false;
              local_18f8._M_p = (pointer)&local_18e8;
              local_18f0 = 0;
              local_18e8._M_local_buf[0] = '\0';
              iVar3 = __isoc99_sscanf(&local_1038,"function %06X %06X %s",&local_18d8,&local_18d4,
                                      &local_1838);
              if (iVar3 < 1) {
                iVar3 = __isoc99_sscanf(&local_1038,"line %06X",&local_18d8);
                if (iVar3 < 1) {
                  iVar3 = __isoc99_sscanf(&local_1038,"comment %06X \"%[^\"]",&local_18d8,local_1438
                                         );
                  if (iVar3 < 1) {
                    iVar3 = __isoc99_sscanf(&local_1038,"label %06X %s",&local_18d8,&local_1838);
                    if (iVar3 < 1) {
                      iVar3 = __isoc99_sscanf(&local_1038,"data %06X %06X %s",&local_18d8,
                                              &local_18d4,&local_1838);
                      if (iVar3 < 1) {
                        printf("%s:%d: Not supported format!\n\t\'%s\'\n",
                               (local_1868->_M_dataplus)._M_p,(ulong)uVar9,&local_1038);
                        exit(99);
                      }
                      local_1948._0_4_ = 2;
                      goto LAB_00123445;
                    }
                    goto LAB_00123203;
                  }
                  local_1948._0_4_ = 3;
                  if (local_18c8 == 0) {
                    strlen(local_1438);
                    std::__cxx11::string::_M_replace
                              ((ulong)&local_18d0,0,(char *)0x0,(ulong)local_1438);
                  }
                  else {
                    local_1858[0] = local_1848;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_1858,local_18d0,local_18d0 + local_18c8);
                    std::__cxx11::string::append((char *)local_1858);
                    plVar5 = (long *)std::__cxx11::string::append((char *)local_1858);
                    plVar7 = plVar5 + 2;
                    if ((long *)*plVar5 == plVar7) {
                      local_1898 = *plVar7;
                      lStack_1890 = plVar5[3];
                      local_18a8 = &local_1898;
                    }
                    else {
                      local_1898 = *plVar7;
                      local_18a8 = (long *)*plVar5;
                    }
                    local_18a0 = plVar5[1];
                    *plVar5 = (long)plVar7;
                    plVar5[1] = 0;
                    *(undefined1 *)(plVar5 + 2) = 0;
                    std::__cxx11::string::operator=((string *)&local_18d0,(string *)&local_18a8);
                    if (local_18a8 != &local_1898) {
                      operator_delete(local_18a8);
                    }
                    if (local_1858[0] != local_1848) {
                      operator_delete(local_1858[0]);
                    }
                    local_194c = true;
                  }
                  std::__cxx11::string::_M_replace((ulong)&local_1888,0,local_1880,0x16c0b3);
                }
                else {
LAB_00123203:
                  local_1948._0_4_ = 3;
                }
                local_18d4 = local_18d8;
              }
              else {
                local_1948._0_4_ = 1;
              }
LAB_00123445:
              std::__cxx11::string::_M_assign((string *)&local_18f8);
              std::__cxx11::string::_M_assign((string *)&local_1920);
              uVar2 = local_1948._16_8_;
              local_1900 = local_194c;
              strlen(&local_1838);
              std::__cxx11::string::_M_replace
                        ((ulong)(local_1948 + 8),0,(char *)uVar2,(ulong)&local_1838);
              std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::
              push_back(&this->_annotations,(value_type *)local_1948);
              local_18c8 = 0;
              *local_18d0 = 0;
              local_1880 = (char *)0x0;
              *local_1888 = 0;
              local_1838 = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_18f8._M_p != &local_18e8) {
                operator_delete(local_18f8._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1920._M_p != &local_1910) {
                operator_delete(local_1920._M_p);
              }
              if (local_1948._8_8_ != (long)local_1948 + 0x18) {
                operator_delete((void *)local_1948._8_8_);
              }
              local_194c = false;
            }
            else {
              if (CONCAT13(cStack_182d,CONCAT12(cStack_182e,CONCAT11(cStack_182f,cStack_1830))) ==
                  0x72736a &&
                  CONCAT17(cStack_1831,
                           CONCAT16(cStack_1832,
                                    CONCAT15(cStack_1833,
                                             CONCAT14(cStack_1834,
                                                      CONCAT13(cStack_1835,
                                                               CONCAT12(cStack_1836,
                                                                        CONCAT11(cStack_1837,
                                                                                 local_1838)))))))
                  == 0x5f73695f706d756a) {
                local_1948[0] = '\x01';
              }
              else {
                auVar11[0] = -(local_1838 == 'j');
                auVar11[1] = -(cStack_1837 == 'u');
                auVar11[2] = -(cStack_1836 == 'm');
                auVar11[3] = -(cStack_1835 == 'p');
                auVar11[4] = -(cStack_1834 == '_');
                auVar11[5] = -(cStack_1833 == 'i');
                auVar11[6] = -(cStack_1832 == 's');
                auVar11[7] = -(cStack_1831 == '_');
                auVar11[8] = -(cStack_1830 == 'j');
                auVar11[9] = -(cStack_182f == 's');
                auVar11[10] = -(cStack_182e == 'r');
                auVar11[0xb] = -(cStack_182d == '_');
                auVar11[0xc] = -(cStack_182c == 'i');
                auVar11[0xd] = -(cStack_182b == 's');
                auVar11[0xe] = -(cStack_182a == 'h');
                auVar11[0xf] = -(cStack_1829 == '\0');
                if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
                  local_1948[0] = '\x02';
                }
                else if (CONCAT17(cStack_182e,
                                  CONCAT16(cStack_182f,
                                           CONCAT15(cStack_1830,
                                                    CONCAT14(cStack_1831,
                                                             CONCAT13(cStack_1832,
                                                                      CONCAT12(cStack_1833,
                                                                               CONCAT11(cStack_1834,
                                                                                        cStack_1835)
                                                                              )))))) ==
                         0x706d6a5f73695f &&
                         CONCAT17(cStack_1831,
                                  CONCAT16(cStack_1832,
                                           CONCAT15(cStack_1833,
                                                    CONCAT14(cStack_1834,
                                                             CONCAT13(cStack_1835,
                                                                      CONCAT12(cStack_1836,
                                                                               CONCAT11(cStack_1837,
                                                                                        local_1838))
                                                                     ))))) == 0x6a5f73695f72736a) {
                  local_1948[0] = '\x04';
                }
                else if (CONCAT17(cStack_182b,
                                  CONCAT16(cStack_182c,
                                           CONCAT15(cStack_182d,
                                                    CONCAT14(cStack_182e,
                                                             CONCAT13(cStack_182f,
                                                                      CONCAT12(cStack_1830,
                                                                               CONCAT11(cStack_1831,
                                                                                        cStack_1832)
                                                                              )))))) ==
                         0x737961776c615f &&
                         CONCAT17(cStack_1831,
                                  CONCAT16(cStack_1832,
                                           CONCAT15(cStack_1833,
                                                    CONCAT14(cStack_1834,
                                                             CONCAT13(cStack_1835,
                                                                      CONCAT12(cStack_1836,
                                                                               CONCAT11(cStack_1837,
                                                                                        local_1838))
                                                                     ))))) == 0x615f68636e617262) {
                  local_1948[0] = '\b';
                }
                else if (CONCAT17(cStack_182c,
                                  CONCAT16(cStack_182d,
                                           CONCAT15(cStack_182e,
                                                    CONCAT14(cStack_182f,
                                                             CONCAT13(cStack_1830,
                                                                      CONCAT12(cStack_1831,
                                                                               CONCAT11(cStack_1832,
                                                                                        cStack_1833)
                                                                              )))))) ==
                         0x726576656e5f68 &&
                         CONCAT17(cStack_1831,
                                  CONCAT16(cStack_1832,
                                           CONCAT15(cStack_1833,
                                                    CONCAT14(cStack_1834,
                                                             CONCAT13(cStack_1835,
                                                                      CONCAT12(cStack_1836,
                                                                               CONCAT11(cStack_1837,
                                                                                        local_1838))
                                                                     ))))) == 0x6e5f68636e617262) {
                  local_1948[0] = '\x10';
                }
                else if (CONCAT17(cStack_182a,
                                  CONCAT16(cStack_182b,
                                           CONCAT15(cStack_182c,
                                                    CONCAT14(cStack_182d,
                                                             CONCAT13(cStack_182e,
                                                                      CONCAT12(cStack_182f,
                                                                               CONCAT11(cStack_1830,
                                                                                        cStack_1831)
                                                                              )))))) ==
                         0x656772656d5f65 &&
                         CONCAT17(cStack_1831,
                                  CONCAT16(cStack_1832,
                                           CONCAT15(cStack_1833,
                                                    CONCAT14(cStack_1834,
                                                             CONCAT13(cStack_1835,
                                                                      CONCAT12(cStack_1836,
                                                                               CONCAT11(cStack_1837,
                                                                                        local_1838))
                                                                     ))))) == 0x657461746f6e6e61) {
                  local_1948[0] = ' ';
                }
                else {
                  printf("Unknown hint \'%s\'\n",&local_1838);
                }
              }
              local_1948._4_4_ = local_18ac;
              uVar2 = local_1948._0_8_;
              __position._M_current =
                   (this->_hints).
                   super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>._M_impl
                   .super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->_hints).
                  super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<snestistics::Hint,std::allocator<snestistics::Hint>>::
                _M_realloc_insert<snestistics::Hint_const&>
                          (local_1860,__position,(Hint *)local_1948);
              }
              else {
                (__position._M_current)->hints = local_1948[0];
                *(undefined3 *)&(__position._M_current)->field_0x1 = local_1948._1_3_;
                (__position._M_current)->location = local_18ac;
                ppHVar1 = &(this->_hints).
                           super__Vector_base<snestistics::Hint,_std::allocator<snestistics::Hint>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppHVar1 = *ppHVar1 + 1;
                local_1948._0_8_ = uVar2;
              }
            }
          }
        }
      }
      else if (local_1038 == 0x3b) {
        pcVar8 = &local_1037;
        if (local_1037 == ' ') {
          pcVar8 = local_1036;
        }
        if (local_1037 == '\0') {
          pcVar8 = "";
        }
        if (local_18c8 == 0) {
          strlen(pcVar8);
          std::__cxx11::string::_M_replace((ulong)&local_18d0,0,(char *)0x0,(ulong)pcVar8);
        }
        else {
          local_18a8 = &local_1898;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_18a8,local_18d0,local_18d0 + local_18c8);
          std::__cxx11::string::append((char *)&local_18a8);
          pHVar4 = (Hint *)std::__cxx11::string::append((char *)&local_18a8);
          local_1948._0_8_ = (long)local_1948 + 0x10;
          HVar6 = (Hint)(pHVar4 + 2);
          if (*pHVar4 == HVar6) {
            local_1948._16_8_ = *(undefined8 *)HVar6;
            local_1948._24_8_ = pHVar4[3];
          }
          else {
            local_1948._16_8_ = *(undefined8 *)HVar6;
            local_1948._0_8_ = *pHVar4;
          }
          local_1948._8_8_ = pHVar4[1];
          *pHVar4 = HVar6;
          pHVar4[1].hints = '\0';
          *(undefined3 *)&pHVar4[1].field_0x1 = 0;
          pHVar4[1].location = 0;
          pHVar4[2].hints = '\0';
          std::__cxx11::string::operator=((string *)&local_18d0,(string *)local_1948);
          if (local_1948._0_8_ != (long)local_1948 + 0x10) {
            operator_delete((void *)local_1948._0_8_);
          }
          if (local_18a8 != &local_1898) {
            operator_delete(local_18a8);
          }
          local_194c = true;
        }
      }
      else if (local_1038 != 0x40) goto LAB_00122eba;
      lVar10 = *(long *)(*(long *)input + -0x18);
      uVar9 = uVar9 + 1;
    } while (((byte)input[lVar10 + 0x20] & 2) == 0);
    if (local_1888 != local_1878) {
      operator_delete(local_1888);
    }
  }
  if (local_18d0 != local_18c0) {
    operator_delete(local_18d0);
  }
  return;
}

Assistant:

void AnnotationResolver::load(std::istream &input, const std::string &error_file) {
	std::string comment;
	std::string useComment;
	bool comment_is_multiline = false;

	char name[1024]="";
	char mycomment[1024];

	Pointer start;

	int size;

	std::istream &f = input;

	int line_number = 0;
	
	while (!f.eof()) {
		line_number++;
		char buf[4096];
		f.getline(buf, 4096);

		size = 0;

		if (strlen(buf) == 0) {
			continue;
		}
		if (buf[0] == '@') {
			// meta-comment
			continue;
		} else if (buf[0] == ';') {
			const char *stripped = &buf[2];
			if (buf[1]=='\0') {
				stripped = "";
			} else if (buf[1] != ' ') {
				stripped = &buf[1];
			}
			if (!comment.empty()) {
				comment = comment + "\n" + stripped;
				comment_is_multiline = true;
			}
			else {
				comment = stripped;
			}
		}
		else if (buf[0] == '#') {
			useComment = &buf[2];
		} else if (sscanf(buf, "hint %06X %s", &start, (char*)&name) > 0) {

			Hint ta;
			if (strcmp(name, "jump_is_jsr")==0) {
				ta.hints = Hint::JUMP_IS_JSR;
			} else if (strcmp(name, "jump_is_jsr_ish")==0) {
				ta.hints = Hint::JUMP_IS_JSR_ISH;
			} else if (strcmp(name, "jsr_is_jmp")==0) {
				ta.hints = Hint::JSR_IS_JMP;
			} else if (strcmp(name, "branch_always") == 0) {
				ta.hints = Hint::BRANCH_ALWAYS;
			} else if (strcmp(name, "branch_never") == 0) {
				ta.hints = Hint::BRANCH_NEVER;
			} else if (strcmp(name, "annotate_merge") == 0) {
				ta.hints = Hint::ANNOTATE_MERGE;
			} else {
				printf("Unknown hint '%s'\n", name);
			}
			ta.location = start;
			_hints.push_back(ta);
			continue;
		} else {

			Annotation a;

			if (sscanf(buf, "function %06X %06X %s", &a.startOfRange, &a.endOfRange, name) > 0) {
				a.type = ANNOTATION_FUNCTION;
				const bool convert_single_byte_functions_to_labels = false;
				if (convert_single_byte_functions_to_labels && a.startOfRange == a.endOfRange) {
					a.type = ANNOTATION_LINE;
					printf("Function '%s' is only one byte long, treating as 'label' instead!\n", name);
					a.endOfRange = a.startOfRange;
				}
			} else if (sscanf(buf, "line %06X", &a.startOfRange) > 0) { // TODO: Does this makes sense?
				a.type = ANNOTATION_LINE;
				a.endOfRange = a.startOfRange;
			} else if (sscanf(buf, "comment %06X \"%[^\"]", &a.startOfRange, mycomment) > 0) {
				a.type = ANNOTATION_LINE;
				if (comment.empty()) {
					comment = mycomment;
				} else {
					comment = comment + "\n" + mycomment;
					comment_is_multiline = true;
				}
				useComment = "";
				a.endOfRange = a.startOfRange;
			} else if (sscanf(buf, "label %06X %s", &a.startOfRange, name) > 0) {
				a.type = ANNOTATION_LINE;
				a.endOfRange = a.startOfRange;
			} else if (sscanf(buf, "data %06X %06X %s", &a.startOfRange, &a.endOfRange, name) >0 ) {
				a.type = ANNOTATION_DATA;
			} else {
				printf("%s:%d: Not supported format!\n\t'%s'\n", error_file.c_str(), line_number, buf);
				exit(99);
			}


			a.useComment = useComment;
			a.comment = comment;
			a.comment_is_multiline = comment_is_multiline;
			a.name = name;
			_annotations.push_back(a);

			// Reset state
			comment.clear();
			useComment.clear();
			comment_is_multiline = false;
			name[0]='\0';
		}
	}
}